

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_linal_mat2quat(double *q,double *R)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  *q = *R + 1.0 + R[4] + R[8];
  q[1] = ((*R + 1.0) - R[4]) - R[8];
  q[2] = ((1.0 - *R) + R[4]) - R[8];
  q[3] = ((1.0 - *R) - R[4]) + R[8];
  uVar1 = 0;
  do {
    dVar2 = q[uVar1];
    if (1.0 <= dVar2) {
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      q[uVar1] = dVar2 * 0.5;
      if (uVar1 < 4) {
        dVar2 = 1.0 / (dVar2 * 0.5 * 4.0);
        switch(uVar1) {
        case 0:
          q[1] = (R[5] - R[7]) * dVar2;
          q[2] = (R[6] - R[2]) * dVar2;
          dVar3 = R[1] - R[3];
          break;
        case 1:
          *q = (R[5] - R[7]) * dVar2;
          q[2] = (R[1] + R[3]) * dVar2;
          dVar3 = R[6] + R[2];
          break;
        case 2:
          *q = (R[6] - R[2]) * dVar2;
          q[1] = (R[1] + R[3]) * dVar2;
          dVar3 = R[5] + R[7];
          break;
        case 3:
          *q = (R[1] - R[3]) * dVar2;
          q[1] = (R[6] + R[2]) * dVar2;
          q[2] = (R[5] + R[7]) * dVar2;
          return;
        }
        q[3] = dVar3 * dVar2;
        return;
      }
      goto LAB_001081e9;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 4);
  dVar2 = q[4];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  q[4] = dVar2 * 0.5;
LAB_001081e9:
  q[2] = 0.0;
  q[3] = 0.0;
  *q = 0.0;
  q[1] = 0.0;
  return;
}

Assistant:

void fsnav_linal_mat2quat(double* q, double* R)
{
	size_t i;
	double _q4;

	// absolute values squared four times
	q[0] = 1 + R[0] + R[4] + R[8];
	q[1] = 1 + R[0] - R[4] - R[8];
	q[2] = 1 - R[0] + R[4] - R[8];
	q[3] = 1 - R[0] - R[4] + R[8];

	for (i = 0; i < 4; i++)
		if (q[i] >= 1)
			break;

	q[i] = sqrt(q[i])/2;
	_q4 = 1/(4*q[i]);
	switch (i) {
		case 0:
			q[1] = (R[5]-R[7])*_q4;
			q[2] = (R[6]-R[2])*_q4;
			q[3] = (R[1]-R[3])*_q4;
			break;
		case 1:
			q[0] = (R[5]-R[7])*_q4;
			q[2] = (R[1]+R[3])*_q4;
			q[3] = (R[6]+R[2])*_q4;
			break;
		case 2:
			q[0] = (R[6]-R[2])*_q4;
			q[1] = (R[1]+R[3])*_q4;
			q[3] = (R[5]+R[7])*_q4;
			break;
		case 3:
			q[0] = (R[1]-R[3])*_q4;
			q[1] = (R[6]+R[2])*_q4;
			q[2] = (R[5]+R[7])*_q4;
			break;
		default: // invalid matrix
			q[0] = 0;
			q[1] = 0;
			q[2] = 0;
			q[3] = 0;
			break;
	}
}